

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O0

void traversestrongtable(global_State *g,Table *h)

{
  byte bVar1;
  Node *pNVar2;
  uint local_2c;
  uint i;
  Node *limit;
  Node *n;
  Table *h_local;
  global_State *g_local;
  
  pNVar2 = h->node;
  bVar1 = h->lsizenode;
  for (local_2c = 0; local_2c < h->sizearray; local_2c = local_2c + 1) {
    if ((h->array[local_2c].tt_ & 0x8000) != 0) {
      if ((h->array[local_2c].tt_ & 0x8000) == 0) {
        __assert_fail("(((&h->array[i])->tt_) & (1 << 15))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                      ,0x262,"void traversestrongtable(global_State *, Table *)");
      }
      if ((h->array[local_2c].tt_ & 0x7f) != (ushort)(h->array[local_2c].value_.gc)->tt) {
LAB_0014481a:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                      ,0x262,"void traversestrongtable(global_State *, Table *)");
      }
      if (g->mainthread != (lua_State *)0x0) {
        if ((h->array[local_2c].tt_ & 0x8000) == 0) {
          __assert_fail("(((&h->array[i])->tt_) & (1 << 15))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                        ,0x262,"void traversestrongtable(global_State *, Table *)");
        }
        if (((h->array[local_2c].value_.gc)->marked & (g->mainthread->l_G->currentwhite ^ 0x18)) !=
            0) goto LAB_0014481a;
      }
    }
    if ((h->array[local_2c].tt_ & 0x8000) != 0) {
      if ((h->array[local_2c].tt_ & 0x8000) == 0) {
        __assert_fail("(((&h->array[i])->tt_) & (1 << 15))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                      ,0x262,"void traversestrongtable(global_State *, Table *)");
      }
      if (((h->array[local_2c].value_.gc)->marked & 0x18) != 0) {
        if ((h->array[local_2c].tt_ & 0x8000) == 0) {
          __assert_fail("(((&h->array[i])->tt_) & (1 << 15))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                        ,0x262,"void traversestrongtable(global_State *, Table *)");
        }
        reallymarkobject(g,h->array[local_2c].value_.gc);
      }
    }
  }
  limit = h->node;
  do {
    if (pNVar2 + (1 << (bVar1 & 0x1f)) <= limit) {
      if (9 < (h->tt & 0xf)) {
        __assert_fail("(((h)->tt) & 0x0F) < (9+1)",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                      ,0x26c,"void traversestrongtable(global_State *, Table *)");
      }
      genlink(g,(GCObject *)h);
      return;
    }
    if ((limit->i_val).tt_ == 0) {
      removeentry(limit);
    }
    else {
      if ((limit->i_key).nk.tt_ == 0) {
        __assert_fail("!((((((const TValue*)((&(n)->i_key.tvk)))))->tt_) == (0))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                      ,0x267,"void traversestrongtable(global_State *, Table *)");
      }
      if (((limit->i_key).nk.tt_ & 0x8000) != 0) {
        if (((limit->i_key).nk.tt_ & 0x8000) == 0) {
          __assert_fail("(((((const TValue*)((&(n)->i_key.tvk))))->tt_) & (1 << 15))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                        ,0x268,"void traversestrongtable(global_State *, Table *)");
        }
        if (((limit->i_key).nk.tt_ & 0x7f) != (ushort)((limit->i_key).nk.value_.gc)->tt) {
LAB_00144a6f:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                        ,0x268,"void traversestrongtable(global_State *, Table *)");
        }
        if (g->mainthread != (lua_State *)0x0) {
          if (((limit->i_key).nk.tt_ & 0x8000) == 0) {
            __assert_fail("(((((const TValue*)((&(n)->i_key.tvk))))->tt_) & (1 << 15))",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                          ,0x268,"void traversestrongtable(global_State *, Table *)");
          }
          if ((((limit->i_key).nk.value_.gc)->marked & (g->mainthread->l_G->currentwhite ^ 0x18)) !=
              0) goto LAB_00144a6f;
        }
      }
      if (((limit->i_key).nk.tt_ & 0x8000) != 0) {
        if (((limit->i_key).nk.tt_ & 0x8000) == 0) {
          __assert_fail("(((((const TValue*)((&(n)->i_key.tvk))))->tt_) & (1 << 15))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                        ,0x268,"void traversestrongtable(global_State *, Table *)");
        }
        if ((((limit->i_key).nk.value_.gc)->marked & 0x18) != 0) {
          if (((limit->i_key).nk.tt_ & 0x8000) == 0) {
            __assert_fail("(((((const TValue*)((&(n)->i_key.tvk))))->tt_) & (1 << 15))",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                          ,0x268,"void traversestrongtable(global_State *, Table *)");
          }
          reallymarkobject(g,(limit->i_key).nk.value_.gc);
        }
      }
      if (((limit->i_val).tt_ & 0x8000) != 0) {
        if (((limit->i_val).tt_ & 0x8000) == 0) {
          __assert_fail("((((&(n)->i_val))->tt_) & (1 << 15))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                        ,0x269,"void traversestrongtable(global_State *, Table *)");
        }
        if (((limit->i_val).tt_ & 0x7f) != (ushort)((limit->i_val).value_.gc)->tt) {
LAB_00144c0b:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                        ,0x269,"void traversestrongtable(global_State *, Table *)");
        }
        if (g->mainthread != (lua_State *)0x0) {
          if (((limit->i_val).tt_ & 0x8000) == 0) {
            __assert_fail("((((&(n)->i_val))->tt_) & (1 << 15))",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                          ,0x269,"void traversestrongtable(global_State *, Table *)");
          }
          if ((((limit->i_val).value_.gc)->marked & (g->mainthread->l_G->currentwhite ^ 0x18)) != 0)
          goto LAB_00144c0b;
        }
      }
      if (((limit->i_val).tt_ & 0x8000) != 0) {
        if (((limit->i_val).tt_ & 0x8000) == 0) {
          __assert_fail("((((&(n)->i_val))->tt_) & (1 << 15))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                        ,0x269,"void traversestrongtable(global_State *, Table *)");
        }
        if ((((limit->i_val).value_.gc)->marked & 0x18) != 0) {
          if (((limit->i_val).tt_ & 0x8000) == 0) {
            __assert_fail("((((&(n)->i_val))->tt_) & (1 << 15))",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                          ,0x269,"void traversestrongtable(global_State *, Table *)");
          }
          reallymarkobject(g,(limit->i_val).value_.gc);
        }
      }
    }
    limit = limit + 1;
  } while( true );
}

Assistant:

static void traversestrongtable (global_State *g, Table *h) {
  Node *n, *limit = gnodelast(h);
  unsigned int i;
  for (i = 0; i < h->sizearray; i++)  /* traverse array part */
    markvalue(g, &h->array[i]);
  for (n = gnode(h, 0); n < limit; n++) {  /* traverse hash part */
    if (ttisnil(gval(n)))  /* entry is empty? */
      removeentry(n);  /* remove it */
    else {
      lua_assert(!ttisnil(gkey(n)));
      markvalue(g, gkey(n));  /* mark key */
      markvalue(g, gval(n));  /* mark value */
    }
  }
  genlink(g, obj2gco(h));
}